

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpphttplibconnector.hpp
# Opt level: O0

string * __thiscall
CppHttpLibClientConnector::Send
          (string *__return_storage_ptr__,CppHttpLibClientConnector *this,string *request)

{
  bool bVar1;
  Response *pRVar2;
  JsonRpcException *this_00;
  allocator<char> local_91;
  string local_90;
  undefined1 local_60 [8];
  Result res;
  string *request_local;
  CppHttpLibClientConnector *this_local;
  
  res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)request;
  httplib::Client::Post((Result *)local_60,&this->httpClient,"/jsonrpc",request,"application/json");
  bVar1 = httplib::Result::operator_cast_to_bool((Result *)local_60);
  if ((bVar1) && (pRVar2 = httplib::Result::operator->((Result *)local_60), pRVar2->status == 200))
  {
    pRVar2 = httplib::Result::operator->((Result *)local_60);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pRVar2->body);
    httplib::Result::~Result((Result *)local_60);
    return __return_storage_ptr__;
  }
  this_00 = (JsonRpcException *)__cxa_allocate_exception(0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"client connector error, received status != 200",&local_91);
  jsonrpccxx::JsonRpcException::JsonRpcException(this_00,-0x7d03,&local_90);
  __cxa_throw(this_00,&jsonrpccxx::JsonRpcException::typeinfo,
              jsonrpccxx::JsonRpcException::~JsonRpcException);
}

Assistant:

std::string Send(const std::string &request) override {
    auto res = httpClient.Post("/jsonrpc", request, "application/json");
    if (!res || res->status != 200) {
      throw jsonrpccxx::JsonRpcException(-32003, "client connector error, received status != 200");
    }
    return res->body;
  }